

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImU32 col;
  ImU32 IVar5;
  ImGuiCol idx;
  bool bVar6;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  uint in_XMM0_Dd;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float fVar9;
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  float fVar13;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_ca;
  bool local_c9;
  ImRect local_c8;
  float local_b4;
  float local_b0;
  ImDrawCornerFlags local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar13 = (bb_frame->Max).x - (bb_frame->Min).x;
    if (fVar13 <= 0.0) {
      return false;
    }
    fVar12 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar12 <= 0.0) {
      return false;
    }
    fVar11 = 1.0;
    if (axis == ImGuiAxis_Y) {
      fVar9 = (GImGui->Style).FramePadding.y;
      fVar9 = fVar9 + fVar9;
      if (fVar12 < fVar9 + GImGui->FontSize) {
        fVar9 = (fVar12 - GImGui->FontSize) / fVar9;
        fVar11 = 1.0;
        if (fVar9 <= 1.0) {
          fVar11 = fVar9;
        }
        fVar11 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar11);
      }
    }
    if (0.0 < fVar11) {
      local_78 = ZEXT416((uint)fVar11);
      fVar9 = (fVar13 + -2.0) * 0.5;
      iVar4 = (int)fVar9;
      fVar13 = -3.0;
      fVar11 = -3.0;
      if (iVar4 < 4) {
        fVar11 = -(float)(int)fVar9;
      }
      fVar9 = -0.0;
      if (-1 < iVar4) {
        fVar9 = fVar11;
      }
      fVar12 = (fVar12 + -2.0) * 0.5;
      iVar4 = (int)fVar12;
      if (iVar4 < 4) {
        fVar13 = -(float)(int)fVar12;
      }
      fVar12 = -0.0;
      if (-1 < iVar4) {
        fVar12 = fVar13;
      }
      local_c8.Min.x = (bb_frame->Min).x;
      local_c8.Min.y = (bb_frame->Min).y;
      local_c8.Min.x = local_c8.Min.x - fVar9;
      local_c8.Min.y = local_c8.Min.y - fVar12;
      local_c8.Max.x = (bb_frame->Max).x;
      local_c8.Max.x = fVar9 + local_c8.Max.x;
      local_c8.Max.y = (bb_frame->Max).y;
      local_c8.Max.y = fVar12 + local_c8.Max.y;
      if (axis == ImGuiAxis_X) {
        local_b4 = local_c8.Max.x - local_c8.Min.x;
      }
      else {
        local_b4 = local_c8.Max.y - local_c8.Min.y;
      }
      uStack_84 = in_XMM0_Db & in_XMM1_Db;
      uStack_80 = in_XMM0_Dc & in_XMM1_Dc;
      uStack_7c = in_XMM0_Dd & in_XMM1_Dd;
      local_88 = (float)(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v |
                        -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v);
      local_a8._4_4_ = in_XMM1_Db;
      local_a8._0_4_ = size_contents_v;
      local_a8._8_4_ = in_XMM1_Dc;
      local_a8._12_4_ = in_XMM1_Dd;
      local_ac = rounding_corners;
      local_68 = size_avail_v;
      if (0.0 < local_88) {
        local_98 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
        local_ca = false;
        local_c9 = false;
        uStack_64 = in_XMM0_Db;
        uStack_60 = in_XMM0_Dc;
        uStack_5c = in_XMM0_Dd;
        ButtonBehavior(&local_c8,id,&local_c9,&local_ca,0x40000);
        fVar13 = local_88;
        if (local_88 <= 1.0) {
          fVar13 = 1.0;
        }
        fVar11 = (float)local_a8._0_4_ - local_68;
        fVar12 = (local_68 / fVar13) * local_b4;
        fVar13 = local_b4;
        if (fVar12 <= local_b4) {
          fVar13 = fVar12;
        }
        uStack_64 = uStack_64 & local_98._4_4_;
        uStack_60 = uStack_60 & local_98._8_4_;
        uStack_5c = uStack_5c & local_98._12_4_;
        local_68 = (float)(-(uint)(fVar12 < (float)local_98._0_4_) & local_98._0_4_ |
                          ~-(uint)(fVar12 < (float)local_98._0_4_) & (uint)fVar13);
        fVar13 = 1.0;
        if (1.0 <= fVar11) {
          fVar13 = fVar11;
        }
        fVar12 = *p_scroll_v / fVar13;
        auVar7 = ZEXT812(0x3f800000);
        if (fVar12 <= 1.0) {
          auVar7._4_8_ = 0;
          auVar7._0_4_ = fVar12;
        }
        fVar11 = local_b4 - local_68;
        local_a8._4_4_ = 0;
        local_a8._0_4_ = ((float)(~-(uint)(fVar12 < 0.0) & auVar7._0_4_) * fVar11) / local_b4;
        local_a8._8_4_ = auVar7._8_4_;
        local_a8._12_4_ = 0;
        if (((1.0 <= (float)local_78._0_4_) && (fVar12 = local_68 / local_b4, fVar12 < 1.0)) &&
           (local_ca != false)) {
          local_98._0_4_ = fVar13;
          local_b0 = fVar11;
          local_88 = fVar12;
          uStack_84 = uStack_64;
          uStack_80 = uStack_60;
          uStack_7c = uStack_5c;
          if (1 < (uint)axis) {
            __assert_fail("idx <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                          ,0xe2,"float &ImVec2::operator[](size_t)");
          }
          fVar13 = (*(float *)((pIVar3->IO).MouseDown + (ulong)(uint)axis * 4 + -8) -
                   (&local_c8.Min.x)[(uint)axis]) / local_b4;
          auVar8 = ZEXT812(0x3f800000);
          if (fVar13 <= 1.0) {
            auVar8._4_8_ = 0;
            auVar8._0_4_ = fVar13;
          }
          local_58._0_4_ = ~-(uint)(fVar13 < 0.0) & auVar8._0_4_;
          local_58._4_4_ = 0;
          local_58._8_4_ = auVar8._8_4_;
          local_58._12_4_ = 0;
          SetHoveredID(id);
          if (pIVar3->ActiveIdIsJustActivated == true) {
            bVar2 = local_88 + (float)local_a8._0_4_ < (float)local_58._0_4_;
            bVar6 = bVar2 || (float)local_58._0_4_ < (float)local_a8._0_4_;
            fVar13 = 0.0;
            if (!bVar2 && (float)local_58._0_4_ >= (float)local_a8._0_4_) {
              fVar13 = local_88 * -0.5 + ((float)local_58._0_4_ - (float)local_a8._0_4_);
            }
            pIVar3->ScrollbarClickDeltaToGrabCenter = fVar13;
          }
          else {
            bVar6 = false;
          }
          auVar10 = ZEXT812(0x3f800000);
          fVar12 = (((float)local_58._0_4_ - pIVar3->ScrollbarClickDeltaToGrabCenter) -
                   local_88 * 0.5) / (1.0 - local_88);
          fVar13 = 1.0;
          if (fVar12 <= 1.0) {
            fVar13 = fVar12;
          }
          fVar13 = (float)(int)((float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13) *
                                (float)local_98._0_4_ + 0.5);
          *p_scroll_v = fVar13;
          fVar13 = fVar13 / (float)local_98._0_4_;
          if (fVar13 <= auVar10._0_4_) {
            auVar10._4_8_ = auVar10._4_8_;
            auVar10._0_4_ = fVar13;
          }
          fVar13 = (local_b0 * (float)(~-(uint)(fVar13 < 0.0) & auVar10._0_4_)) / local_b4;
          local_a8 = ZEXT416((uint)fVar13);
          if (bVar6) {
            pIVar3->ScrollbarClickDeltaToGrabCenter =
                 -local_88 * 0.5 + ((float)local_58._0_4_ - fVar13);
          }
        }
        col = GetColorU32(0xe,1.0);
        idx = 0x11;
        if (local_ca == false) {
          idx = (local_c9 & 1) + 0xf;
        }
        IVar5 = GetColorU32(idx,(float)local_78._0_4_);
        local_78._0_4_ = IVar5;
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,
                   local_ac);
        if (axis == ImGuiAxis_X) {
          local_48.x = local_c8.Min.x + (local_c8.Max.x - local_c8.Min.x) * (float)local_a8._0_4_;
          aIStack_40[0].x = local_68 + local_48.x;
          local_48.y = local_c8.Min.y;
          aIStack_40[0].y = local_c8.Max.y;
        }
        else {
          local_48.y = (local_c8.Max.y - local_c8.Min.y) * (float)local_a8._0_4_ + local_c8.Min.y;
          aIStack_40[0].y = local_68 + local_48.y;
          aIStack_40[0].x = local_c8.Max.x;
          local_48.x = local_c8.Min.x;
        }
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&local_48,aIStack_40,local_78._0_4_,
                   (pIVar3->Style).ScrollbarRounding,0xf);
        return local_ca;
      }
      __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x397,
                    "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                   );
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}